

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_c_sol.c
# Opt level: O0

NLW2_SOLHandler_C * MakeSOLHandler_C(CAPIExample *pex)

{
  void *in_RSI;
  NLW2_SOLHandler_C *in_RDI;
  NLW2_SOLHandler_C *result;
  
  NLW2_MakeSOLHandler_C_Default();
  in_RDI->p_user_data_ = in_RSI;
  in_RDI->Header = CAPI_ex_Header;
  in_RDI->OnDualSolution = OnDualSolution;
  in_RDI->OnPrimalSolution = OnPrimalSolution;
  in_RDI->OnObjno = OnObjno;
  in_RDI->OnSolveCode = OnSolveCode;
  in_RDI->OnIntSuffix = OnIntSuffix;
  in_RDI->OnDblSuffix = OnDblSuffix;
  return in_RDI;
}

Assistant:

NLW2_SOLHandler_C MakeSOLHandler_C(CAPIExample* pex) {
  NLW2_SOLHandler_C result
      = NLW2_MakeSOLHandler_C_Default();

  result.p_user_data_ = pex;

  result.Header = CAPI_ex_Header;
  // solve message: use default (print it)
  // AMPL options: use default
  result.OnDualSolution = OnDualSolution;
  result.OnPrimalSolution = OnPrimalSolution;
  result.OnObjno = OnObjno;
  result.OnSolveCode = OnSolveCode;
  result.OnIntSuffix = OnIntSuffix;
  result.OnDblSuffix = OnDblSuffix;

  return result;
}